

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::link_compute_shader(NegativeTestContext *ctx)

{
  char *pcVar1;
  char *local_130;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  GLuint local_c8;
  GLuint local_c4;
  GLuint computeShader310;
  GLuint computeShader_1;
  GLuint program_1;
  GLint linkStatus_1;
  char *computeShaderSource310;
  string local_a8;
  char *local_88;
  char *otherShaderSource;
  GLuint otherShader;
  GLuint computeShader;
  GLuint program;
  GLint linkStatus;
  int ndx;
  allocator<char> local_59;
  string local_58;
  undefined8 uStack_38;
  GLenum shaderTypes [5];
  char *local_18;
  char *computeShaderSource;
  NegativeTestContext *ctx_local;
  
  local_18 = "#version 320 es\nvoid main (void)\n{\n}\n";
  uStack_38 = 0x8b3000008b31;
  shaderTypes[0] = 0x8dd9;
  shaderTypes[1] = 0x8e88;
  shaderTypes[2] = 0x8e87;
  computeShaderSource = (char *)ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Compute Shader linked with shader of other kind.",&local_59);
  NegativeTestContext::beginSection(ctx,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  for (program = 0; (int)program < 5; program = program + 1) {
    computeShader = 0xffffffff;
    otherShader = glu::CallLogWrapper::glCreateProgram((CallLogWrapper *)computeShaderSource);
    otherShaderSource._4_4_ =
         glu::CallLogWrapper::glCreateShader((CallLogWrapper *)computeShaderSource,0x91b9);
    otherShaderSource._0_4_ =
         glu::CallLogWrapper::glCreateShader
                   ((CallLogWrapper *)computeShaderSource,shaderTypes[(long)(int)program + -2]);
    if (shaderTypes[(long)(int)program + -2] == 0x8dd9) {
      local_130 = "#version 320 es\nlayout(max_vertices = 3) out;\nvoid main(void){}\n";
    }
    else {
      local_130 = local_18;
    }
    local_88 = local_130;
    glu::CallLogWrapper::glShaderSource
              ((CallLogWrapper *)computeShaderSource,otherShaderSource._4_4_,1,&local_18,
               (GLint *)0x0);
    glu::CallLogWrapper::glShaderSource
              ((CallLogWrapper *)computeShaderSource,(GLuint)otherShaderSource,1,&local_88,
               (GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              ((CallLogWrapper *)computeShaderSource,otherShaderSource._4_4_);
    glu::CallLogWrapper::glCompileShader
              ((CallLogWrapper *)computeShaderSource,(GLuint)otherShaderSource);
    glu::CallLogWrapper::glAttachShader
              ((CallLogWrapper *)computeShaderSource,otherShader,otherShaderSource._4_4_);
    glu::CallLogWrapper::glAttachShader
              ((CallLogWrapper *)computeShaderSource,otherShader,(GLuint)otherShaderSource);
    glu::CallLogWrapper::glLinkProgram((CallLogWrapper *)computeShaderSource,otherShader);
    glu::CallLogWrapper::glGetProgramiv
              ((CallLogWrapper *)computeShaderSource,otherShader,0x8b82,(GLint *)&computeShader);
    glu::CallLogWrapper::glDeleteShader
              ((CallLogWrapper *)computeShaderSource,(GLuint)otherShaderSource);
    glu::CallLogWrapper::glDeleteShader
              ((CallLogWrapper *)computeShaderSource,otherShaderSource._4_4_);
    glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)computeShaderSource,otherShader);
    pcVar1 = computeShaderSource;
    if (computeShader != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"Program should not have linked",
                 (allocator<char> *)((long)&computeShaderSource310 + 7));
      NegativeTestContext::fail((NegativeTestContext *)pcVar1,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&computeShaderSource310 + 7));
    }
  }
  NegativeTestContext::endSection((NegativeTestContext *)computeShaderSource);
  _program_1 = "#version 310 es\nvoid main (void)\n{\n}\n";
  computeShader_1 = 0xffffffff;
  computeShader310 = glu::CallLogWrapper::glCreateProgram((CallLogWrapper *)computeShaderSource);
  local_c4 = glu::CallLogWrapper::glCreateShader((CallLogWrapper *)computeShaderSource,0x91b9);
  local_c8 = glu::CallLogWrapper::glCreateShader((CallLogWrapper *)computeShaderSource,0x8b30);
  glu::CallLogWrapper::glShaderSource
            ((CallLogWrapper *)computeShaderSource,local_c4,1,&local_18,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource
            ((CallLogWrapper *)computeShaderSource,local_c8,1,(GLchar **)&program_1,(GLint *)0x0);
  pcVar1 = computeShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,
             "Compute Shader should not be linked with shaders of different version.",&local_e9);
  NegativeTestContext::beginSection((NegativeTestContext *)pcVar1,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  glu::CallLogWrapper::glCompileShader((CallLogWrapper *)computeShaderSource,local_c4);
  glu::CallLogWrapper::glCompileShader((CallLogWrapper *)computeShaderSource,local_c8);
  glu::CallLogWrapper::glAttachShader
            ((CallLogWrapper *)computeShaderSource,computeShader310,local_c4);
  glu::CallLogWrapper::glAttachShader
            ((CallLogWrapper *)computeShaderSource,computeShader310,local_c8);
  glu::CallLogWrapper::glLinkProgram((CallLogWrapper *)computeShaderSource,computeShader310);
  glu::CallLogWrapper::glGetProgramiv
            ((CallLogWrapper *)computeShaderSource,computeShader310,0x8b82,(GLint *)&computeShader_1
            );
  glu::CallLogWrapper::glDeleteShader((CallLogWrapper *)computeShaderSource,local_c8);
  glu::CallLogWrapper::glDeleteShader((CallLogWrapper *)computeShaderSource,local_c4);
  glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)computeShaderSource,computeShader310);
  pcVar1 = computeShaderSource;
  if (computeShader_1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"Program should not have linked",&local_111);
    NegativeTestContext::fail((NegativeTestContext *)pcVar1,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  NegativeTestContext::endSection((NegativeTestContext *)computeShaderSource);
  return;
}

Assistant:

void link_compute_shader (NegativeTestContext& ctx)
{
	const char* computeShaderSource		=	"#version 320 es\n"
											"void main (void)\n"
											"{\n"
											"}\n\0";
	{
		const GLenum shaderTypes[]			=	{
													GL_VERTEX_SHADER,
													GL_FRAGMENT_SHADER,
													GL_GEOMETRY_SHADER,
													GL_TESS_CONTROL_SHADER,
													GL_TESS_EVALUATION_SHADER
												};

		ctx.beginSection("Compute Shader linked with shader of other kind.");
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(shaderTypes); ndx++)
		{
			GLint linkStatus				=	-1;
			GLuint program					=	ctx.glCreateProgram();
			GLuint computeShader			=	ctx.glCreateShader(GL_COMPUTE_SHADER);
			GLuint otherShader				=	ctx.glCreateShader(shaderTypes[ndx]);
			const char* otherShaderSource	=	(shaderTypes[ndx] != GL_GEOMETRY_SHADER)	?
												computeShaderSource							:
												"#version 320 es\n"
												"layout(max_vertices = 3) out;\n"
												"void main(void){}\n\0";

			ctx.glShaderSource(computeShader, 1, &computeShaderSource, DE_NULL);
			ctx.glShaderSource(otherShader, 1, &otherShaderSource, DE_NULL);
			ctx.glCompileShader(computeShader);
			ctx.glCompileShader(otherShader);
			ctx.glAttachShader(program, computeShader);
			ctx.glAttachShader(program, otherShader);
			ctx.glLinkProgram(program);
			ctx.glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);
			ctx.glDeleteShader(otherShader);
			ctx.glDeleteShader(computeShader);
			ctx.glDeleteProgram(program);
			if (linkStatus != GL_FALSE)
				ctx.fail("Program should not have linked");
		}
		ctx.endSection();
	}
	{
		const char* computeShaderSource310	=	"#version 310 es\n"
												"void main (void)\n"
												"{\n"
												"}\n\0";
		GLint linkStatus					=	-1;
		GLuint program						=	ctx.glCreateProgram();
		GLuint computeShader				=	ctx.glCreateShader(GL_COMPUTE_SHADER);
		GLuint computeShader310				=	ctx.glCreateShader(GL_FRAGMENT_SHADER);

		ctx.glShaderSource(computeShader, 1, &computeShaderSource, DE_NULL);
		ctx.glShaderSource(computeShader310, 1, &computeShaderSource310, DE_NULL);
		ctx.beginSection("Compute Shader should not be linked with shaders of different version.");
		ctx.glCompileShader(computeShader);
		ctx.glCompileShader(computeShader310);
		ctx.glAttachShader(program, computeShader);
		ctx.glAttachShader(program, computeShader310);
		ctx.glLinkProgram(program);
		ctx.glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);
		ctx.glDeleteShader(computeShader310);
		ctx.glDeleteShader(computeShader);
		ctx.glDeleteProgram(program);
		if (linkStatus != GL_FALSE)
			ctx.fail("Program should not have linked");
		ctx.endSection();
	}
}